

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d62_q1b_queue_count.cpp
# Opt level: O0

int main(void)

{
  istream *this;
  size_t sVar1;
  ostream *this_00;
  queue<int,_std::deque<int,_std::allocator<int>_>_> local_d0;
  int local_70;
  int local_6c;
  int a;
  int i;
  queue<int,_std::deque<int,_std::allocator<int>_>_> q;
  int local_10;
  int k;
  int n;
  
  k = 0;
  std::ios_base::sync_with_stdio(false);
  std::ios::tie((ostream *)((long)&std::cin + *(long *)(std::cin + -0x18)));
  this = (istream *)std::istream::operator>>((istream *)&std::cin,&local_10);
  std::istream::operator>>
            (this,(int *)((long)&q.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
                                 super__Deque_impl_data._M_finish._M_node + 4));
  std::queue<int,std::deque<int,std::allocator<int>>>::
  queue<std::deque<int,std::allocator<int>>,void>
            ((queue<int,std::deque<int,std::allocator<int>>> *)&a);
  for (local_6c = 0; local_6c < local_10; local_6c = local_6c + 1) {
    std::istream::operator>>((istream *)&std::cin,&local_70);
    std::queue<int,_std::deque<int,_std::allocator<int>_>_>::push
              ((queue<int,_std::deque<int,_std::allocator<int>_>_> *)&a,&local_70);
  }
  std::queue<int,_std::deque<int,_std::allocator<int>_>_>::queue
            (&local_d0,(queue<int,_std::deque<int,_std::allocator<int>_>_> *)&a);
  sVar1 = qcount(&local_d0,
                 q.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
                 _M_finish._M_node._4_4_);
  this_00 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,sVar1);
  std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  std::queue<int,_std::deque<int,_std::allocator<int>_>_>::~queue(&local_d0);
  std::queue<int,_std::deque<int,_std::allocator<int>_>_>::~queue
            ((queue<int,_std::deque<int,_std::allocator<int>_>_> *)&a);
  return k;
}

Assistant:

int main() {
    // for faster cin, cout
    ios_base::sync_with_stdio(false);
    cin.tie(0);
    int n, k;
    cin >> n >> k;
    queue<int> q;
    for (int i = 0; i < n; i++) {
        int a;
        cin >> a;
        q.push(a);
    }
    cout << qcount(q, k) << endl;
}